

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::recreateLayout(QWizardPrivate *this,QWizardLayoutInfo *info)

{
  WizardStyle WVar1;
  long lVar2;
  QWizardRuler *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  QPalettePrivate *pQVar9;
  Representation RVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint column;
  long *plVar14;
  long lVar15;
  QObject *pQVar16;
  QWizardHeader *pQVar17;
  QWidget *pQVar18;
  QPalette *pQVar19;
  QLabel *pQVar20;
  QSpacerItem *this_00;
  QWatermarkLabel *pQVar21;
  bool enabled;
  int rightMargin;
  uint right;
  byte bVar22;
  Weight WVar23;
  ColorGroup CVar24;
  QLayout *this_01;
  int iVar25;
  undefined1 uVar26;
  int iVar27;
  uint w;
  int topMargin;
  uint uVar28;
  int iVar29;
  long in_FS_OFFSET;
  QByteArrayView QVar30;
  int local_b4;
  QBrush local_90 [8];
  QColor local_88;
  undefined8 local_78;
  QPalettePrivate *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [8];
  undefined1 *puStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  iVar11 = (**(code **)(*(long *)&this->mainLayout->super_QLayout + 200))();
  if (0 < iVar11) {
    uVar28 = iVar11 + 1;
    do {
      plVar14 = (long *)(**(code **)(*(long *)&this->mainLayout->super_QLayout + 0xb0))
                                  (this->mainLayout,uVar28 - 2);
      lVar15 = (**(code **)(*plVar14 + 0x70))(plVar14);
      if (lVar15 == 0) {
        (**(code **)(*plVar14 + 8))(plVar14);
      }
      else {
        pQVar16 = (QObject *)(**(code **)(*plVar14 + 0x70))();
        QObject::setParent(pQVar16);
      }
      uVar28 = uVar28 - 1;
    } while (1 < uVar28);
  }
  iVar11 = QGridLayout::columnCount(this->mainLayout);
  if (0 < iVar11) {
    uVar28 = iVar11 + 1;
    do {
      QGridLayout::setColumnMinimumWidth(this->mainLayout,uVar28 - 2,0);
      uVar28 = uVar28 - 1;
    } while (1 < uVar28);
  }
  iVar11 = QGridLayout::rowCount(this->mainLayout);
  if (0 < iVar11) {
    uVar28 = iVar11 + 1;
    do {
      QGridLayout::setRowMinimumHeight(this->mainLayout,uVar28 - 2,0);
      uVar28 = uVar28 - 1;
    } while (1 < uVar28);
  }
  WVar1 = info->wizStyle;
  iVar12 = info->topLevelMarginLeft - info->childMarginLeft;
  iVar11 = info->topLevelMarginBottom;
  uVar28 = iVar11 - info->childMarginBottom;
  iVar13 = iVar11 - info->vspacing;
  if (WVar1 == MacStyle) {
    local_58 = (undefined1  [8])0x0;
    puStack_50 = (undefined1 *)0x0;
    QLayout::setContentsMargins(&this->mainLayout->super_QLayout,(QMargins *)local_58);
    (**(code **)(*(long *)&this->mainLayout->super_QLayout + 0x68))(this->mainLayout,0);
    QLayout::setContentsMargins((QLayout *)this->buttonLayout,0x14,0xd,0x14,0x11);
    QLayout::setContentsMargins((QLayout *)this->pageVBoxLayout,7,7,7,7);
    local_b4 = 3;
    column = 1;
  }
  else {
    iVar27 = info->topLevelMarginRight;
    iVar29 = info->topLevelMarginTop;
    column = (byte)(info->sideWidget | info->watermark) & 1;
    local_b4 = column + 1;
    if (WVar1 == ModernStyle) {
      iVar11 = info->childMarginRight;
      iVar25 = info->childMarginTop;
      local_58 = (undefined1  [8])0x0;
      puStack_50 = (undefined1 *)0x0;
      QLayout::setContentsMargins(&this->mainLayout->super_QLayout,(QMargins *)local_58);
      (**(code **)(*(long *)&this->mainLayout->super_QLayout + 0x68))(this->mainLayout,0);
      QLayout::setContentsMargins
                ((QLayout *)this->pageVBoxLayout,iVar12,iVar29 - iVar25,iVar27 - iVar11,uVar28);
      this_01 = (QLayout *)this->buttonLayout;
      iVar11 = info->topLevelMarginTop;
      iVar27 = info->topLevelMarginLeft;
      iVar29 = info->topLevelMarginRight;
      iVar25 = info->topLevelMarginBottom;
    }
    else {
      QLayout::setContentsMargins
                (&this->mainLayout->super_QLayout,info->topLevelMarginLeft,iVar29,iVar27,iVar11);
      QGridLayout::setHorizontalSpacing(this->mainLayout,info->hspacing);
      QGridLayout::setVerticalSpacing(this->mainLayout,info->vspacing);
      QLayout::setContentsMargins((QLayout *)this->pageVBoxLayout,0,0,0,0);
      this_01 = (QLayout *)this->buttonLayout;
      iVar27 = 0;
      iVar11 = 0;
      iVar29 = 0;
      iVar25 = 0;
    }
    QLayout::setContentsMargins(this_01,iVar27,iVar11,iVar29,iVar25);
  }
  (**(code **)(*(long *)&(this->buttonLayout->super_QBoxLayout).super_QLayout + 0x68))();
  iVar11 = 0;
  if (info->header == true) {
    pQVar17 = this->headerWidget;
    if (pQVar17 == (QWizardHeader *)0x0) {
      pQVar17 = (QWizardHeader *)operator_new(0x60);
      QWizardHeader::QWizardHeader(pQVar17,&this->antiFlickerWidget->super_QWidget);
      this->headerWidget = pQVar17;
    }
    QWidget::setAutoFillBackground(&pQVar17->super_QWidget,WVar1 == ModernStyle);
    iVar11 = 1;
    QGridLayout::addWidget
              (this->mainLayout,&this->headerWidget->super_QWidget,0,0,1,local_b4,(Alignment)0x0);
  }
  if (this->headerWidget != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&this->headerWidget->super_QWidget + 0x68))();
  }
  iVar27 = iVar11;
  if (WVar1 == MacStyle) {
    iVar27 = iVar11 + 1;
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar11,10);
  }
  iVar29 = iVar27;
  if (info->title == true) {
    if (this->titleLabel == (QLabel *)0x0) {
      pQVar18 = (QWidget *)operator_new(0x28);
      QLabel::QLabel((QLabel *)pQVar18,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
      this->titleLabel = (QLabel *)pQVar18;
      QWidget::setBackgroundRole(pQVar18,Base);
      QLabel::setWordWrap(this->titleLabel,true);
    }
    local_68 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_68,(QFont *)(*(long *)(lVar2 + 0x20) + 0x38));
    QFont::pointSize();
    WVar23 = (Weight)(QFont *)&local_68;
    QFont::setPointSize(WVar23);
    QFont::setWeight(WVar23);
    pQVar18 = (QWidget *)this->titleLabel;
    QPalette::QPalette((QPalette *)local_58);
    QWidget::setPalette(pQVar18,(QPalette *)local_58);
    QPalette::~QPalette((QPalette *)local_58);
    if (WVar1 == AeroStyle) {
      QVar30.m_data = (storage_type *)0x8;
      QVar30.m_size = (qsizetype)local_58;
      QString::fromLatin1(QVar30);
      local_88.cspec = local_58._0_4_;
      local_88.ct._0_4_ = local_58._4_4_;
      local_88.ct._4_4_ = SUB84(puStack_50,0);
      local_88.ct.argb.pad = (ushort)((ulong)puStack_50 >> 0x20);
      local_88._14_2_ = SUB82((ulong)puStack_50 >> 0x30,0);
      local_78 = local_48;
      QFont::QFont((QFont *)local_58,(QString *)&local_88,0xc,-1,false);
      pQVar9 = local_68;
      local_68 = (QPalettePrivate *)local_58;
      local_58 = (undefined1  [8])pQVar9;
      RVar10.m_i = puStack_60._0_4_;
      puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,puStack_50._0_4_);
      puStack_50 = (undefined1 *)CONCAT44(puStack_50._4_4_,RVar10.m_i);
      QFont::~QFont((QFont *)local_58);
      piVar8 = (int *)CONCAT44(local_88.ct._0_4_,local_88.cspec);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_88.ct._0_4_,local_88.cspec),2,0x10);
        }
      }
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar19 = QWidget::palette((QWidget *)this->titleLabel);
      QPalette::QPalette((QPalette *)local_58,pQVar19);
      local_88.cspec = Rgb;
      local_88.ct._0_4_ = 0xffff;
      local_88.ct._4_4_ = 0x99993333;
      local_88.ct.argb.pad = 0;
      QBrush::QBrush(local_90,&local_88,SolidPattern);
      QPalette::setBrush((ColorGroup)(QPalette *)local_58,Mid,(QBrush *)0x6);
      QBrush::~QBrush(local_90);
      QWidget::setPalette((QWidget *)this->titleLabel,(QPalette *)local_58);
      QPalette::~QPalette((QPalette *)local_58);
      QWidget::setFont((QWidget *)this->titleLabel,(QFont *)&local_68);
      pQVar20 = this->titleLabel;
      iVar29 = 0x19;
LAB_0050bfa3:
      QLabel::setIndent(pQVar20,iVar29);
    }
    else {
      QWidget::setFont((QWidget *)this->titleLabel,(QFont *)&local_68);
      pQVar20 = this->titleLabel;
      if (WVar1 == MacStyle) {
        iVar29 = 2;
        goto LAB_0050bfa3;
      }
      if (WVar1 == ClassicStyle) {
        QLabel::setIndent(pQVar20,info->childMarginLeft);
      }
      else {
        QLabel::setIndent(pQVar20,info->topLevelMarginLeft);
        if (WVar1 == ModernStyle) {
          pQVar18 = this->placeholderWidget1;
          if (pQVar18 == (QWidget *)0x0) {
            pQVar18 = (QWidget *)operator_new(0x28);
            QWidget::QWidget(pQVar18,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
            this->placeholderWidget1 = pQVar18;
            QWidget::setBackgroundRole(pQVar18,Base);
            pQVar18 = this->placeholderWidget1;
          }
          QWidget::setFixedHeight(pQVar18,info->topLevelMarginLeft + 2);
          QGridLayout::addWidget
                    (this->mainLayout,this->placeholderWidget1,iVar27,column,(Alignment)0x0);
          iVar27 = iVar27 + 1;
        }
      }
    }
    iVar29 = iVar27 + 1;
    QGridLayout::addWidget
              (this->mainLayout,(QWidget *)this->titleLabel,iVar27,column,(Alignment)0x0);
    if (WVar1 == ModernStyle) {
      pQVar18 = this->placeholderWidget2;
      if (pQVar18 == (QWidget *)0x0) {
        pQVar18 = (QWidget *)operator_new(0x28);
        QWidget::QWidget(pQVar18,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
        this->placeholderWidget2 = pQVar18;
        QWidget::setBackgroundRole(pQVar18,Base);
        pQVar18 = this->placeholderWidget2;
      }
      QWidget::setFixedHeight(pQVar18,5);
      QGridLayout::addWidget(this->mainLayout,this->placeholderWidget2,iVar29,column,(Alignment)0x0)
      ;
LAB_0050c073:
      iVar29 = iVar27 + 2;
    }
    else if (WVar1 == MacStyle) {
      QGridLayout::setRowMinimumHeight(this->mainLayout,iVar29,7);
      goto LAB_0050c073;
    }
    QFont::~QFont((QFont *)&local_68);
  }
  if (this->placeholderWidget1 != (QWidget *)0x0) {
    (**(code **)(*(long *)this->placeholderWidget1 + 0x68))();
  }
  if (this->placeholderWidget2 != (QWidget *)0x0) {
    (**(code **)(*(long *)this->placeholderWidget2 + 0x68))();
  }
  bVar22 = info->subTitle;
  if (((bool)bVar22 == true) && (this->subTitleLabel == (QLabel *)0x0)) {
    pQVar20 = (QLabel *)operator_new(0x28);
    QLabel::QLabel(pQVar20,&this->pageFrame->super_QWidget,(WindowFlags)0x0);
    this->subTitleLabel = pQVar20;
    QLabel::setWordWrap(pQVar20,true);
    QWidget::setContentsMargins
              ((QWidget *)this->subTitleLabel,info->childMarginLeft,0,info->childMarginRight,0);
    QBoxLayout::insertWidget
              (&this->pageVBoxLayout->super_QBoxLayout,1,(QWidget *)this->subTitleLabel,0,
               (Alignment)0x0);
    bVar22 = info->subTitle;
  }
  iVar27 = info->childMarginLeft;
  plVar14 = (long *)(**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout +
                                0xa8))();
  this_00 = (QSpacerItem *)(**(code **)(*plVar14 + 0x78))(plVar14);
  if (this_00 != (QSpacerItem *)0x0) {
    if ((bVar22 & 1) == 0) {
      iVar27 = 0;
    }
    QSpacerItem::changeSize(this_00,0,iVar27,Minimum,Minimum);
  }
  w = (uint)(WVar1 == MacStyle);
  iVar27 = 0x21;
  if (WVar1 != MacStyle) {
    iVar27 = 0;
  }
  QFrame::setFrameStyle(this->pageFrame,iVar27);
  QFrame::setLineWidth(this->pageFrame,0);
  QFrame::setMidLineWidth(this->pageFrame,w);
  right = w;
  if (info->header == true) {
    if (WVar1 != ModernStyle) {
      right = iVar12 + 4;
      if (WVar1 != ClassicStyle) {
        right = w;
      }
      goto LAB_0050c201;
    }
    right = info->topLevelMarginLeft;
    w = uVar28;
LAB_0050c21d:
    pQVar18 = &this->pageFrame->super_QWidget;
    uVar28 = right;
  }
  else {
LAB_0050c201:
    if (WVar1 != AeroStyle) goto LAB_0050c21d;
    pQVar18 = &this->pageFrame->super_QWidget;
    uVar28 = 0x12;
  }
  QWidget::setContentsMargins(pQVar18,uVar28,w,right,w);
  if (((info->watermark != false) || (info->sideWidget == true)) &&
     (this->watermarkLabel == (QWatermarkLabel *)0x0)) {
    pQVar21 = (QWatermarkLabel *)operator_new(0x38);
    QWatermarkLabel::QWatermarkLabel
              (pQVar21,&this->antiFlickerWidget->super_QWidget,this->sideWidget);
    this->watermarkLabel = pQVar21;
    QWidget::setBackgroundRole((QWidget *)pQVar21,Base);
    QWidget::setMinimumHeight((QWidget *)this->watermarkLabel,1);
    QWidget::setSizePolicy((QWidget *)this->watermarkLabel,(QSizePolicy)0x700000);
    QLabel::setAlignment(&this->watermarkLabel->super_QLabel,(Alignment)0x21);
  }
  pQVar19 = QWidget::palette(&this->pageFrame->super_QWidget);
  QPalette::brush((ColorGroup)pQVar19,Dark);
  iVar12 = QColor::alpha();
  if (iVar12 < 0xff) {
    if (WVar1 == MacStyle) goto LAB_0050c322;
LAB_0050c34d:
    pQVar18 = &this->pageFrame->super_QWidget;
    QPalette::QPalette((QPalette *)local_58);
    QWidget::setPalette(pQVar18,(QPalette *)local_58);
    QPalette::~QPalette((QPalette *)local_58);
LAB_0050c377:
    enabled = (bool)((info->header ^ 1U) & WVar1 == ModernStyle);
    QWidget::setBackgroundRole(&this->pageFrame->super_QWidget,Window - enabled);
    if ((QWidget *)this->titleLabel != (QWidget *)0x0) {
      QWidget::setAutoFillBackground((QWidget *)this->titleLabel,enabled);
    }
    QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,enabled);
    if (this->watermarkLabel != (QWatermarkLabel *)0x0) {
      QWidget::setAutoFillBackground((QWidget *)this->watermarkLabel,enabled);
    }
    if (this->placeholderWidget1 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground(this->placeholderWidget1,enabled);
    }
    if (this->placeholderWidget2 != (QWidget *)0x0) {
      QWidget::setAutoFillBackground(this->placeholderWidget2,enabled);
    }
    if (WVar1 == AeroStyle) {
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar19 = QWidget::palette(&this->pageFrame->super_QWidget);
      QPalette::QPalette((QPalette *)local_58,pQVar19);
      local_88.cspec = Rgb;
      local_88.ct._0_4_ = 0xffffffff;
      local_88.ct._4_4_ = 0xffffffff;
      local_88.ct.argb.pad = 0;
      QBrush::QBrush((QBrush *)&local_68,&local_88,SolidPattern);
      CVar24 = (ColorGroup)(QPalette *)local_58;
      QPalette::setBrush(CVar24,Mid,(QBrush *)&DAT_0000000a);
      QBrush::~QBrush((QBrush *)&local_68);
      QWidget::setPalette(&this->pageFrame->super_QWidget,(QPalette *)local_58);
      QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,true);
      pQVar19 = QWidget::palette(&this->antiFlickerWidget->super_QWidget);
      QPalette::operator=((QPalette *)local_58,pQVar19);
      local_88.cspec = Rgb;
      local_88.ct._0_4_ = 0xffffffff;
      local_88.ct._4_4_ = 0xffffffff;
      local_88.ct.argb.pad = 0;
      QBrush::QBrush((QBrush *)&local_68,&local_88,SolidPattern);
      QPalette::setBrush(CVar24,Mid,(QBrush *)&DAT_0000000a);
      QBrush::~QBrush((QBrush *)&local_68);
      QWidget::setPalette(&this->antiFlickerWidget->super_QWidget,(QPalette *)local_58);
      QWidget::setAutoFillBackground(&this->antiFlickerWidget->super_QWidget,true);
      QPalette::~QPalette((QPalette *)local_58);
    }
  }
  else {
    pQVar19 = QWidget::palette(&this->pageFrame->super_QWidget);
    QPalette::brush((ColorGroup)pQVar19,Dark);
    iVar12 = QColor::alpha();
    if (WVar1 != MacStyle) {
      if (iVar12 < 0xff) goto LAB_0050c34d;
      goto LAB_0050c377;
    }
LAB_0050c322:
    QWidget::setAutoFillBackground(&this->pageFrame->super_QWidget,true);
    QWidget::setAutoFillBackground(&this->antiFlickerWidget->super_QWidget,false);
  }
  iVar12 = iVar29 + 1;
  QGridLayout::addWidget
            (this->mainLayout,&this->pageFrame->super_QWidget,iVar29,column,(Alignment)0x0);
  if (WVar1 == ClassicStyle) {
    QGridLayout::setRowMinimumHeight(this->mainLayout,iVar12,iVar13);
    uVar28 = (uint)info->extension;
    iVar27 = iVar29 + 2;
    if (info->extension != false) {
      local_b4 = 1;
    }
LAB_0050c619:
    pQVar18 = (QWidget *)this->bottomRuler;
    if (pQVar18 == (QWidget *)0x0) {
      pQVar18 = (QWidget *)operator_new(0x60);
      QWidget::QWidget(pQVar18,&this->antiFlickerWidget->super_QWidget,(WindowFlags)0x0);
      *(undefined ***)pQVar18 = &PTR_metaObject_008054f8;
      *(undefined ***)&pQVar18->super_QPaintDevice = &PTR__QWizardHeader_008056a8;
      QPixmap::QPixmap((QPixmap *)&pQVar18[1].data);
      QWidget::setFixedHeight(pQVar18,2);
      *(undefined ***)pQVar18 = &PTR_metaObject_00806168;
      *(undefined ***)&pQVar18->super_QPaintDevice = &PTR__QWizardRuler_00806318;
      this->bottomRuler = (QWizardRuler *)pQVar18;
    }
    QGridLayout::addWidget(this->mainLayout,pQVar18,iVar27,uVar28,1,local_b4,(Alignment)0x0);
    iVar29 = iVar27 + 1;
    if (WVar1 == ClassicStyle) {
      iVar29 = iVar27 + 2;
      QGridLayout::setRowMinimumHeight(this->mainLayout,iVar27 + 1,iVar13);
    }
    uVar26 = 1;
  }
  else {
    if (WVar1 == AeroStyle) {
      QLayout::setContentsMargins((QLayout *)this->buttonLayout,9,9,9,9);
      QLayout::setContentsMargins(&this->mainLayout->super_QLayout,0,0xb,0,0);
      uVar28 = (uint)info->extension;
      if (info->extension != false) {
        local_b4 = 1;
      }
    }
    else {
      uVar28 = (uint)info->extension;
      if (info->extension != false) {
        local_b4 = 1;
      }
      iVar27 = iVar12;
      if (WVar1 == ModernStyle) goto LAB_0050c619;
    }
    uVar26 = 0;
    iVar29 = iVar12;
  }
  QGridLayout::addLayout
            (this->mainLayout,(QLayout *)this->buttonLayout,iVar29,uVar28,1,local_b4,(Alignment)0x0)
  ;
  if ((info->watermark != false) || (iVar13 = 0xb5, info->sideWidget == true)) {
    if (info->extension != false) {
      iVar12 = iVar29 + 1;
    }
    QGridLayout::addWidget
              (this->mainLayout,(QWidget *)this->watermarkLabel,iVar11,0,iVar12 - iVar11,1,
               (Alignment)0x0);
    iVar13 = 0xb5;
    if ((info->watermark & 1U) != 0) {
      iVar13 = 0;
    }
  }
  if (WVar1 != MacStyle) {
    iVar13 = 0;
  }
  QGridLayout::setColumnMinimumWidth(this->mainLayout,0,iVar13);
  if (WVar1 == MacStyle) {
    QGridLayout::setColumnMinimumWidth(this->mainLayout,2,0x15);
  }
  pQVar17 = this->headerWidget;
  if (pQVar17 != (QWizardHeader *)0x0) {
    (**(code **)(*(long *)&pQVar17->super_QWidget + 0x68))(pQVar17,info->header);
  }
  pQVar20 = this->titleLabel;
  if (pQVar20 != (QLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar20->super_QFrame).super_QWidget + 0x68))(pQVar20,info->title);
  }
  pQVar20 = this->subTitleLabel;
  if (pQVar20 != (QLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar20->super_QFrame).super_QWidget + 0x68))(pQVar20,info->subTitle);
  }
  pQVar3 = this->bottomRuler;
  if (pQVar3 != (QWizardRuler *)0x0) {
    (**(code **)(*(long *)&(pQVar3->super_QWizardHeader).super_QWidget + 0x68))(pQVar3,uVar26);
  }
  pQVar21 = this->watermarkLabel;
  if (pQVar21 != (QWatermarkLabel *)0x0) {
    (**(code **)(*(long *)&(pQVar21->super_QLabel).super_QFrame.super_QWidget + 0x68))
              (pQVar21,(info->sideWidget | info->watermark) & 1);
  }
  *(undefined8 *)((long)&(this->layoutInfo).wizStyle + 2) =
       *(undefined8 *)((long)&info->wizStyle + 2);
  iVar11 = info->topLevelMarginLeft;
  iVar12 = info->topLevelMarginRight;
  iVar13 = info->topLevelMarginTop;
  iVar27 = info->topLevelMarginBottom;
  iVar29 = info->childMarginLeft;
  iVar25 = info->childMarginRight;
  iVar4 = info->childMarginTop;
  iVar5 = info->childMarginBottom;
  iVar6 = info->vspacing;
  iVar7 = info->buttonSpacing;
  WVar1 = info->wizStyle;
  (this->layoutInfo).hspacing = info->hspacing;
  (this->layoutInfo).vspacing = iVar6;
  (this->layoutInfo).buttonSpacing = iVar7;
  (this->layoutInfo).wizStyle = WVar1;
  (this->layoutInfo).childMarginLeft = iVar29;
  (this->layoutInfo).childMarginRight = iVar25;
  (this->layoutInfo).childMarginTop = iVar4;
  (this->layoutInfo).childMarginBottom = iVar5;
  (this->layoutInfo).topLevelMarginLeft = iVar11;
  (this->layoutInfo).topLevelMarginRight = iVar12;
  (this->layoutInfo).topLevelMarginTop = iVar13;
  (this->layoutInfo).topLevelMarginBottom = iVar27;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::recreateLayout(const QWizardLayoutInfo &info)
{
    Q_Q(QWizard);

    /*
        Start by undoing the main layout.
    */
    for (int i = mainLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = mainLayout->takeAt(i);
        if (item->layout()) {
            item->layout()->setParent(nullptr);
        } else {
            delete item;
        }
    }
    for (int i = mainLayout->columnCount() - 1; i >= 0; --i)
        mainLayout->setColumnMinimumWidth(i, 0);
    for (int i = mainLayout->rowCount() - 1; i >= 0; --i)
        mainLayout->setRowMinimumHeight(i, 0);

    /*
        Now, recreate it.
    */

    bool mac = (info.wizStyle == QWizard::MacStyle);
    bool classic = (info.wizStyle == QWizard::ClassicStyle);
    bool modern = (info.wizStyle == QWizard::ModernStyle);
    bool aero = (info.wizStyle == QWizard::AeroStyle);
    int deltaMarginLeft = info.topLevelMarginLeft - info.childMarginLeft;
    int deltaMarginRight = info.topLevelMarginRight - info.childMarginRight;
    int deltaMarginTop = info.topLevelMarginTop - info.childMarginTop;
    int deltaMarginBottom = info.topLevelMarginBottom - info.childMarginBottom;
    int deltaVSpacing = info.topLevelMarginBottom - info.vspacing;

    int row = 0;
    int numColumns;
    if (mac) {
        numColumns = 3;
    } else if (info.watermark || info.sideWidget) {
        numColumns = 2;
    } else {
        numColumns = 1;
    }
    int pageColumn = qMin(1, numColumns - 1);

    if (mac) {
        mainLayout->setContentsMargins(QMargins());
        mainLayout->setSpacing(0);
        buttonLayout->setContentsMargins(MacLayoutLeftMargin, MacButtonTopMargin, MacLayoutRightMargin, MacLayoutBottomMargin);
        pageVBoxLayout->setContentsMargins(7, 7, 7, 7);
    } else {
        if (modern) {
            mainLayout->setContentsMargins(QMargins());
            mainLayout->setSpacing(0);
            pageVBoxLayout->setContentsMargins(deltaMarginLeft, deltaMarginTop,
                                               deltaMarginRight, deltaMarginBottom);
            buttonLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                             info.topLevelMarginRight, info.topLevelMarginBottom);
        } else {
            mainLayout->setContentsMargins(info.topLevelMarginLeft, info.topLevelMarginTop,
                                           info.topLevelMarginRight, info.topLevelMarginBottom);
            mainLayout->setHorizontalSpacing(info.hspacing);
            mainLayout->setVerticalSpacing(info.vspacing);
            pageVBoxLayout->setContentsMargins(0, 0, 0, 0);
            buttonLayout->setContentsMargins(0, 0, 0, 0);
        }
    }
    buttonLayout->setSpacing(info.buttonSpacing);

    if (info.header) {
        if (!headerWidget)
            headerWidget = new QWizardHeader(antiFlickerWidget);
        headerWidget->setAutoFillBackground(modern);
        mainLayout->addWidget(headerWidget, row++, 0, 1, numColumns);
    }
    if (headerWidget)
        headerWidget->setVisible(info.header);

    int watermarkStartRow = row;

    if (mac)
        mainLayout->setRowMinimumHeight(row++, 10);

    if (info.title) {
        if (!titleLabel) {
            titleLabel = new QLabel(antiFlickerWidget);
            titleLabel->setBackgroundRole(QPalette::Base);
            titleLabel->setWordWrap(true);
        }

        QFont titleFont = q->font();
        titleFont.setPointSize(titleFont.pointSize() + (mac ? 3 : 4));
        titleFont.setBold(true);
        titleLabel->setPalette(QPalette());

        if (aero) {
            // ### hardcoded for now:
            titleFont = QFont("Segoe UI"_L1, 12);
            QPalette pal(titleLabel->palette());
            pal.setColor(QPalette::Text, QColor(0x00, 0x33, 0x99));
            titleLabel->setPalette(pal);
        }

        titleLabel->setFont(titleFont);
        const int aeroTitleIndent = 25; // ### hardcoded for now - should be calculated somehow
        if (aero)
            titleLabel->setIndent(aeroTitleIndent);
        else if (mac)
            titleLabel->setIndent(2);
        else if (classic)
            titleLabel->setIndent(info.childMarginLeft);
        else
            titleLabel->setIndent(info.topLevelMarginLeft);
        if (modern) {
            if (!placeholderWidget1) {
                placeholderWidget1 = new QWidget(antiFlickerWidget);
                placeholderWidget1->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget1->setFixedHeight(info.topLevelMarginLeft + 2);
            mainLayout->addWidget(placeholderWidget1, row++, pageColumn);
        }
        mainLayout->addWidget(titleLabel, row++, pageColumn);
        if (modern) {
            if (!placeholderWidget2) {
                placeholderWidget2 = new QWidget(antiFlickerWidget);
                placeholderWidget2->setBackgroundRole(QPalette::Base);
            }
            placeholderWidget2->setFixedHeight(5);
            mainLayout->addWidget(placeholderWidget2, row++, pageColumn);
        }
        if (mac)
            mainLayout->setRowMinimumHeight(row++, 7);
    }
    if (placeholderWidget1)
        placeholderWidget1->setVisible(info.title && modern);
    if (placeholderWidget2)
        placeholderWidget2->setVisible(info.title && modern);

    if (info.subTitle) {
        if (!subTitleLabel) {
            subTitleLabel = new QLabel(pageFrame);
            subTitleLabel->setWordWrap(true);

            subTitleLabel->setContentsMargins(info.childMarginLeft , 0,
                                              info.childMarginRight , 0);

            pageVBoxLayout->insertWidget(1, subTitleLabel);
        }
    }

    // ### try to replace with margin.
    changeSpacerSize(pageVBoxLayout, 0, 0, info.subTitle ? info.childMarginLeft : 0);

    int hMargin = mac ? 1 : 0;
    int vMargin = hMargin;

    pageFrame->setFrameStyle(mac ? (QFrame::Box | QFrame::Raised) : QFrame::NoFrame);
    pageFrame->setLineWidth(0);
    pageFrame->setMidLineWidth(hMargin);

    if (info.header) {
        if (modern) {
            hMargin = info.topLevelMarginLeft;
            vMargin = deltaMarginBottom;
        } else if (classic) {
            hMargin = deltaMarginLeft + ClassicHMargin;
            vMargin = 0;
        }
    }

    if (aero) {
        int leftMargin   = 18; // ### hardcoded for now - should be calculated somehow
        int topMargin    = vMargin;
        int rightMargin  = hMargin; // ### for now
        int bottomMargin = vMargin;
        pageFrame->setContentsMargins(leftMargin, topMargin, rightMargin, bottomMargin);
    } else {
        pageFrame->setContentsMargins(hMargin, vMargin, hMargin, vMargin);
    }

    if ((info.watermark || info.sideWidget) && !watermarkLabel) {
        watermarkLabel = new QWatermarkLabel(antiFlickerWidget, sideWidget);
        watermarkLabel->setBackgroundRole(QPalette::Base);
        watermarkLabel->setMinimumHeight(1);
        watermarkLabel->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Expanding);
        watermarkLabel->setAlignment(Qt::AlignLeft | Qt::AlignTop);
    }

    //bool wasSemiTransparent = pageFrame->testAttribute(Qt::WA_SetPalette);
    const bool wasSemiTransparent =
        pageFrame->palette().brush(QPalette::Window).color().alpha() < 255
        || pageFrame->palette().brush(QPalette::Base).color().alpha() < 255;
    if (mac) {
        pageFrame->setAutoFillBackground(true);
        antiFlickerWidget->setAutoFillBackground(false);
    } else {
        if (wasSemiTransparent)
            pageFrame->setPalette(QPalette());

        bool baseBackground = (modern && !info.header); // ### TAG1
        pageFrame->setBackgroundRole(baseBackground ? QPalette::Base : QPalette::Window);

        if (titleLabel)
            titleLabel->setAutoFillBackground(baseBackground);
        pageFrame->setAutoFillBackground(baseBackground);
        if (watermarkLabel)
            watermarkLabel->setAutoFillBackground(baseBackground);
        if (placeholderWidget1)
            placeholderWidget1->setAutoFillBackground(baseBackground);
        if (placeholderWidget2)
            placeholderWidget2->setAutoFillBackground(baseBackground);

        if (aero) {
            QPalette pal = pageFrame->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            pageFrame->setPalette(pal);
            pageFrame->setAutoFillBackground(true);
            pal = antiFlickerWidget->palette();
            pal.setBrush(QPalette::Window, QColor(255, 255, 255));
            antiFlickerWidget->setPalette(pal);
            antiFlickerWidget->setAutoFillBackground(true);
        }
    }

    mainLayout->addWidget(pageFrame, row++, pageColumn);

    int watermarkEndRow = row;
    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    if (aero) {
        buttonLayout->setContentsMargins(9, 9, 9, 9);
        mainLayout->setContentsMargins(0, 11, 0, 0);
    }

    int buttonStartColumn = info.extension ? 1 : 0;
    int buttonNumColumns = info.extension ? 1 : numColumns;

    if (classic || modern) {
        if (!bottomRuler)
            bottomRuler = new QWizardRuler(antiFlickerWidget);
        mainLayout->addWidget(bottomRuler, row++, buttonStartColumn, 1, buttonNumColumns);
    }

    if (classic)
        mainLayout->setRowMinimumHeight(row++, deltaVSpacing);

    mainLayout->addLayout(buttonLayout, row++, buttonStartColumn, 1, buttonNumColumns);

    if (info.watermark || info.sideWidget) {
        if (info.extension)
            watermarkEndRow = row;
        mainLayout->addWidget(watermarkLabel, watermarkStartRow, 0,
                              watermarkEndRow - watermarkStartRow, 1);
    }

    mainLayout->setColumnMinimumWidth(0, mac && !info.watermark ? 181 : 0);
    if (mac)
        mainLayout->setColumnMinimumWidth(2, 21);

    if (headerWidget)
        headerWidget->setVisible(info.header);
    if (titleLabel)
        titleLabel->setVisible(info.title);
    if (subTitleLabel)
        subTitleLabel->setVisible(info.subTitle);
    if (bottomRuler)
        bottomRuler->setVisible(classic || modern);
    if (watermarkLabel)
        watermarkLabel->setVisible(info.watermark || info.sideWidget);

    layoutInfo = info;
}